

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_texture_conversion.cpp
# Opt level: O2

bool crnlib::texture_conversion::dxt_progress_callback_func
               (uint percentage_complete,void *pUser_data_ptr)

{
  code *pcVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  
  if (*(char *)((long)pUser_data_ptr + 0xc) == '\0') {
    pcVar1 = *(code **)(*pUser_data_ptr + 0x3f8);
    if (pcVar1 == (code *)0x0) {
      return true;
    }
    uVar3 = (100 - *(int *)((long)pUser_data_ptr + 8)) * percentage_complete;
    iVar4 = *(int *)((long)pUser_data_ptr + 8) + uVar3 / 100;
    if (99 < iVar4) {
      iVar4 = 100;
    }
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    cVar2 = (*pcVar1)(iVar4,*(undefined8 *)(*pUser_data_ptr + 0x400),(ulong)uVar3 % 100);
    if (cVar2 != '\0') {
      return true;
    }
    *(undefined1 *)((long)pUser_data_ptr + 0xc) = 1;
  }
  return false;
}

Assistant:

static bool dxt_progress_callback_func(uint percentage_complete, void* pUser_data_ptr) {
  progress_params& params = *static_cast<progress_params*>(pUser_data_ptr);

  if (params.m_canceled)
    return false;

  if (!params.m_pParams->m_pProgress_func)
    return true;

  int scaled_percentage_complete = params.m_start_percentage + (percentage_complete * (100 - params.m_start_percentage)) / 100;

  scaled_percentage_complete = math::clamp<int>(scaled_percentage_complete, 0, 100);

  if (!params.m_pParams->m_pProgress_func(scaled_percentage_complete, params.m_pParams->m_pProgress_user_data)) {
    params.m_canceled = true;
    return false;
  }

  return true;
}